

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O2

UINT16 __thiscall
VGMPlayer::GetChipVolume(VGMPlayer *this,UINT8 chipType,UINT8 chipID,UINT8 isLinked)

{
  ushort uVar1;
  pointer pXVar2;
  UINT16 UVar3;
  UINT32 UVar4;
  UINT32 UVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  long lVar9;
  ulong uStack_40;
  
  if (chipType < 0x2a) {
    uVar1 = _CHIP_VOLUME[chipType];
    UVar4 = GetChipCount(this,chipType);
    if (chipType == '\0') {
      UVar5 = GetHeaderChipClock(this,'\0');
      if ((int)UVar5 < 0) {
        UVar4 = 1;
      }
    }
    uVar6 = (uint)(uVar1 >> (chipType == '\x06' && isLinked != '\0'));
    if ((UVar4 & 0xfffe) != 0) {
      uVar6 = uVar6 / (UVar4 & 0xffff);
    }
    bVar8 = isLinked << 7 | chipType;
    pXVar2 = (this->_xHdrChipVol).
             super__Vector_base<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>.
             _M_impl.super__Vector_impl_data._M_start;
    for (lVar9 = 0; uVar7 = uVar6,
        (long)(this->_xHdrChipVol).
              super__Vector_base<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)pXVar2 >> 2 != lVar9;
        lVar9 = lVar9 + 1) {
      if ((pXVar2[lVar9].type == bVar8) && ((pXVar2[lVar9].flags & 1) == chipID)) {
        uVar1 = pXVar2[lVar9].data;
        uVar7 = (uint)uVar1;
        if ((short)uVar1 < 0) {
          uVar7 = uVar6 * (uVar1 & 0x7fff) + 0x80 >> 8;
        }
        break;
      }
    }
    if (bVar8 == 0x1c) {
      uVar6 = (uVar7 & 0xffff) * 2 + 1;
      uStack_40 = 3;
    }
    else {
      if (bVar8 != 0x19) {
        return (UINT16)uVar7;
      }
      uVar6 = (uVar7 & 0xffff) << 3;
      uStack_40 = 5;
    }
    UVar3 = (UINT16)(uVar6 / uStack_40);
  }
  else {
    UVar3 = 0;
  }
  return UVar3;
}

Assistant:

UINT16 VGMPlayer::GetChipVolume(UINT8 chipType, UINT8 chipID, UINT8 isLinked) const
{
	if (chipType >= _CHIP_COUNT)
		return 0;
	
	size_t curChip;
	UINT16 numChips;
	UINT16 vol = _CHIP_VOLUME[chipType];
	
	numChips = GetChipCount(chipType);
	if (chipType == 0x00)
	{
		// The T6W28 consists of 2 "half" chips, so we need to treat it as 1.
		if (GetHeaderChipClock(chipType) & 0x80000000)
			numChips = 1;
	}
	
	if (isLinked)
	{
		if (chipType == 0x06)
			vol /= 2;	// the YM2203's SSG should be half as loud as the FM part
	}
	if (numChips > 1)
		vol /= numChips;
	
	chipType = (isLinked << 7) | (chipType & 0x7F);
	for (curChip = 0; curChip < _xHdrChipVol.size(); curChip ++)
	{
		const XHDR_DATA16& cData = _xHdrChipVol[curChip];
		if (cData.type == chipType && (cData.flags & 0x01) == chipID)
		{
			// Bit 15 - absolute/relative volume
			//	0 - absolute
			//	1 - relative (0x0100 = 1.0, 0x80 = 0.5, etc.)
			if (cData.data & 0x8000)
				vol = MulFixed8x8(vol, cData.data & 0x7FFF);
			else
				vol = cData.data;
			break;
		}
	}
	
	// additional patches for adjusted volume scale in sound cores
	if (chipType == 0x19)	// K051649
		vol = vol * 8 / 5;
	else if (chipType == 0x1C)	// C140/C219
		vol = (vol * 2 + 1) / 3;
	return vol;
}